

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<bool> __thiscall
kj::HttpServer::listenHttpCleanDrain(HttpServer *this,AsyncIoStream *connection)

{
  undefined8 uVar1;
  Connection *pCVar2;
  PromiseNode *pPVar3;
  HttpHeaderTable *this_00;
  AsyncIoStream *in_RDX;
  EagerPromiseNode<bool> *pEVar4;
  EagerPromiseNode<bool> *extraout_RDX;
  EagerPromiseNode<bool> *extraout_RDX_00;
  EagerPromiseNode<bool> *extraout_RDX_01;
  Promise<bool> PVar5;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar6;
  Own<kj::_::EagerPromiseNode<bool>_> OVar7;
  undefined1 local_88 [32];
  Own<kj::HttpServer::Connection> local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  local_88._16_8_ = (AsyncIoStream *)0x0;
  local_88._24_8_ = (HttpService *)0x0;
  if (*(int *)&connection[1].super_AsyncOutputStream._vptr_AsyncOutputStream == 1) {
    heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
              ((kj *)&local_58,(HttpServer *)connection,in_RDX,
               (HttpService *)connection[2].super_AsyncInputStream._vptr_AsyncInputStream);
    local_88._16_8_ = CONCAT44(uStack_54,local_58);
    local_88._24_8_ = (AsyncInputStream *)CONCAT44(uStack_4c,uStack_50);
  }
  else {
    (**(code **)*connection[2].super_AsyncOutputStream._vptr_AsyncOutputStream)(&local_58);
    heap<kj::HttpServer::Connection,kj::HttpServer&,kj::AsyncIoStream&,kj::HttpService&>
              ((kj *)(local_88 + 0x20),(HttpServer *)connection,in_RDX,
               (HttpService *)CONCAT44(uStack_4c,uStack_50));
    local_88._24_8_ = local_68.ptr;
    local_88._16_8_ = operator_new(0x28);
    (((AsyncIoStream *)local_88._16_8_)->super_AsyncOutputStream)._vptr_AsyncOutputStream =
         (_func_int **)CONCAT44(uStack_54,local_58);
    (((AsyncIoStream *)(local_88._16_8_ + 0x10))->super_AsyncInputStream)._vptr_AsyncInputStream =
         (_func_int **)CONCAT44(uStack_4c,uStack_50);
    (((AsyncIoStream *)(local_88._16_8_ + 0x10))->super_AsyncOutputStream)._vptr_AsyncOutputStream =
         (_func_int **)CONCAT44(local_68.disposer._4_4_,local_68.disposer._0_4_);
    (((AsyncIoStream *)(local_88._16_8_ + 0x20))->super_AsyncInputStream)._vptr_AsyncInputStream =
         (_func_int **)local_68.ptr;
    (((AsyncIoStream *)local_88._16_8_)->super_AsyncInputStream)._vptr_AsyncInputStream =
         (_func_int **)&PTR_disposeImpl_00448448;
    local_88._24_8_ = (AsyncInputStream *)0x1;
    if (local_68.ptr != (Connection *)0x0) {
      local_88._24_8_ = local_68.ptr;
    }
  }
  PVar5 = Connection::loop((Connection *)local_88,SUB81(local_88._24_8_,0));
  (*(in_RDX->super_AsyncOutputStream)._vptr_AsyncOutputStream[3])
            (&local_40,&in_RDX->super_AsyncOutputStream,PVar5.super_PromiseBase.node.ptr);
  this_00 = (HttpHeaderTable *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            ((TransformPromiseNodeBase *)this_00,&local_40,
             _::
             TransformPromiseNode<bool,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:5102:62),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->namesById).builder.ptr = (StringPtr *)&PTR_onReady_00446c48;
  local_30.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<bool,kj::_::Void,kj::HttpServer::listenHttpCleanDrain(kj::AsyncIoStream&)::$_0,kj::_::PropagateException>>
        ::instance;
  local_30.ptr = (PromiseNode *)this_00;
  OVar6 = heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_58,(Own<kj::_::PromiseNode> *)local_88,&local_30);
  pPVar3 = local_30.ptr;
  local_68.disposer._0_4_ = local_58;
  local_68.disposer._4_4_ = uStack_54;
  local_68.ptr = (Connection *)CONCAT44(uStack_4c,uStack_50);
  if ((HttpHeaderTable *)local_30.ptr != (HttpHeaderTable *)0x0) {
    local_30.ptr = (PromiseNode *)0x0;
    (**(local_30.disposer)->_vptr_Disposer)
              (local_30.disposer,
               (((Vector<kj::StringPtr> *)&pPVar3->_vptr_PromiseNode)->builder).ptr[-1].content.ptr
               + (long)&((Vector<kj::StringPtr> *)&pPVar3->_vptr_PromiseNode)->builder,OVar6.ptr);
  }
  pPVar3 = local_40.ptr;
  if (local_40.ptr != (PromiseNode *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    (**(local_40.disposer)->_vptr_Disposer)
              (local_40.disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  uVar1 = local_88._8_8_;
  if ((HttpServer *)local_88._8_8_ != (HttpServer *)0x0) {
    local_88._8_8_ = (HttpServer *)0x0;
    (**(code **)*(_func_int **)local_88._0_8_)
              (local_88._0_8_,
               ((ErrorHandler *)uVar1)->_vptr_ErrorHandler[-2] +
               (long)&((ErrorHandler *)uVar1)->_vptr_ErrorHandler);
  }
  Promise<bool>::attach<kj::Own<kj::HttpServer::Connection>>
            ((Promise<bool> *)local_88,(Own<kj::HttpServer::Connection> *)(local_88 + 0x20));
  OVar7 = heap<kj::_::EagerPromiseNode<bool>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_58,(Own<kj::_::PromiseNode> *)local_88);
  uVar1 = local_88._8_8_;
  pEVar4 = OVar7.ptr;
  *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_58;
  *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) = uStack_54;
  *(undefined4 *)&this->timer = uStack_50;
  *(undefined4 *)((long)&this->timer + 4) = uStack_4c;
  if ((HttpServer *)local_88._8_8_ != (HttpServer *)0x0) {
    local_88._8_8_ = (HttpServer *)0x0;
    (**(code **)*(_func_int **)local_88._0_8_)
              (local_88._0_8_,
               ((ErrorHandler *)uVar1)->_vptr_ErrorHandler[-2] +
               (long)&((ErrorHandler *)uVar1)->_vptr_ErrorHandler);
    pEVar4 = extraout_RDX;
  }
  pCVar2 = local_68.ptr;
  if (local_68.ptr != (Connection *)0x0) {
    local_68.ptr = (Connection *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_68.disposer._4_4_,local_68.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_68.disposer._4_4_,local_68.disposer._0_4_),
               (pCVar2->super_Response)._vptr_Response[-2] + (long)&pCVar2->super_Response);
    pEVar4 = extraout_RDX_00;
  }
  uVar1 = local_88._24_8_;
  if ((AsyncInputStream *)local_88._24_8_ != (AsyncInputStream *)0x0) {
    local_88._24_8_ = (HttpService *)0x0;
    (**((AsyncInputStream *)local_88._16_8_)->_vptr_AsyncInputStream)
              (local_88._16_8_,(*(_func_int ***)uVar1)[-2] + (long)(_func_int ***)uVar1);
    pEVar4 = extraout_RDX_01;
  }
  PVar5.super_PromiseBase.node.ptr = (PromiseNode *)pEVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> HttpServer::listenHttpCleanDrain(kj::AsyncIoStream& connection) {
  kj::Own<Connection> obj;

  KJ_SWITCH_ONEOF(service) {
    KJ_CASE_ONEOF(ptr, HttpService*) {
      obj = heap<Connection>(*this, connection, *ptr);
    }
    KJ_CASE_ONEOF(func, HttpServiceFactory) {
      auto srv = func(connection);
      obj = heap<Connection>(*this, connection, *srv);
      obj = obj.attach(kj::mv(srv));
    }
  }

  // Start reading requests and responding to them, but immediately cancel processing if the client
  // disconnects.
  auto promise = obj->loop(true)
      .exclusiveJoin(connection.whenWriteDisconnected().then([]() {return false;}));

  // Eagerly evaluate so that we drop the connection when the promise resolves, even if the caller
  // doesn't eagerly evaluate.
  return promise.attach(kj::mv(obj)).eagerlyEvaluate(nullptr);
}